

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(long lhs,
         SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs)

{
  bool bVar1;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *result_00;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> result;
  long ret;
  long local_38;
  int local_2c;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_28;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_24;
  long local_20;
  
  result_00 = &local_28;
  local_28.m_int = 0;
  local_38 = lhs;
  bVar1 = DivisionCornerCaseHelper2<int,_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
          ::DivisionCornerCase2(lhs,rhs,result_00);
  if (!bVar1) {
    local_20 = 0;
    local_2c = rhs.m_int;
    DivisionHelper<long,int,5>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (&local_38,&local_2c,&local_20);
    result_00 = &local_24;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<long>(result_00,&local_20);
  }
  return (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         result_00->m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}